

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O0

Region * __thiscall Region::GetSelfOrFirstTryAncestor(Region *this)

{
  RegionType RVar1;
  bool bVar2;
  Region *local_18;
  Region *region;
  Region *this_local;
  
  local_18 = this;
  if (this->selfOrFirstTryAncestor == (Region *)0x0) {
    while( true ) {
      bVar2 = false;
      if (local_18 != (Region *)0x0) {
        RVar1 = GetType(local_18);
        bVar2 = RVar1 != RegionTypeTry;
      }
      if (!bVar2) break;
      local_18 = GetParent(local_18);
    }
    this->selfOrFirstTryAncestor = local_18;
  }
  return this->selfOrFirstTryAncestor;
}

Assistant:

Region *
Region::GetSelfOrFirstTryAncestor()
{
    if (!this->selfOrFirstTryAncestor)
    {
        Region* region = this;
        while (region && region->GetType() != RegionTypeTry)
        {
            region = region->GetParent();
        }
        this->selfOrFirstTryAncestor = region;
    }
    return this->selfOrFirstTryAncestor;
}